

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::BasicWriter<char>::write_int<int,fmt::FormatSpec>
          (BasicWriter<char> *this,int value,FormatSpec spec)

{
  bool bVar1;
  char cVar2;
  uint num_digits_00;
  ulong uVar3;
  CharPtr pcVar4;
  char *pcVar5;
  char *local_88;
  char local_79;
  char *local_68;
  char *p_3;
  uint num_digits_3;
  UnsignedType n_2;
  char *p_2;
  uint num_digits_2;
  UnsignedType n_1;
  char *digits;
  char *p_1;
  uint num_digits_1;
  UnsignedType n;
  CharPtr p;
  char local_20 [4];
  uint num_digits;
  char prefix [4];
  UnsignedType abs_value;
  uint prefix_size;
  int value_local;
  BasicWriter<char> *this_local;
  
  prefix[0] = '\0';
  prefix[1] = '\0';
  prefix[2] = '\0';
  prefix[3] = '\0';
  num_digits = value;
  memset(local_20,0,4);
  bVar1 = internal::is_negative<int>(value);
  if (bVar1) {
    local_20[0] = '-';
    prefix = (char  [4])((int)prefix + 1);
    num_digits = -num_digits;
  }
  else {
    bVar1 = FormatSpec::flag(&spec,1);
    if (bVar1) {
      bVar1 = FormatSpec::flag(&spec,2);
      local_79 = '+';
      if (!bVar1) {
        local_79 = ' ';
      }
      local_20[0] = local_79;
      prefix = (char  [4])((int)prefix + 1);
    }
  }
  cVar2 = FormatSpec::type(&spec);
  if (cVar2 == '\0') {
LAB_003a1212:
    num_digits_00 = internal::count_digits(num_digits);
    pcVar4 = prepare_int_buffer<fmt::FormatSpec>(this,num_digits_00,&spec,local_20,(uint)prefix);
    pcVar5 = get(pcVar4 + (1 - (ulong)num_digits_00));
    internal::format_decimal<unsigned_int,char>(pcVar5,num_digits,num_digits_00);
    return;
  }
  if (cVar2 == 'B') {
LAB_003a135c:
    p_2._4_4_ = num_digits;
    bVar1 = FormatSpec::flag(&spec,8);
    if (bVar1) {
      uVar3 = (ulong)(uint)prefix;
      prefix = (char  [4])((int)prefix + 1);
      local_20[uVar3] = '0';
      cVar2 = FormatSpec::type(&spec);
      uVar3 = (ulong)(uint)prefix;
      prefix = (char  [4])((int)prefix + 1);
      local_20[uVar3] = cVar2;
    }
    p_2._0_4_ = 0;
    do {
      p_2._0_4_ = (uint)p_2 + 1;
      p_2._4_4_ = p_2._4_4_ >> 1;
    } while (p_2._4_4_ != 0);
    pcVar4 = prepare_int_buffer<fmt::FormatSpec>(this,(uint)p_2,&spec,local_20,(uint)prefix);
    _num_digits_3 = get(pcVar4);
    p_2._4_4_ = num_digits;
    do {
      *_num_digits_3 = ((byte)p_2._4_4_ & 1) + 0x30;
      p_2._4_4_ = p_2._4_4_ >> 1;
      _num_digits_3 = _num_digits_3 + -1;
    } while (p_2._4_4_ != 0);
  }
  else {
    if (cVar2 != 'X') {
      if (cVar2 == 'b') goto LAB_003a135c;
      if (cVar2 == 'd') goto LAB_003a1212;
      if (cVar2 == 'o') {
        p_3._4_4_ = num_digits;
        bVar1 = FormatSpec::flag(&spec,8);
        if (bVar1) {
          uVar3 = (ulong)(uint)prefix;
          prefix = (char  [4])((int)prefix + 1);
          local_20[uVar3] = '0';
        }
        p_3._0_4_ = 0;
        do {
          p_3._0_4_ = (uint)p_3 + 1;
          p_3._4_4_ = p_3._4_4_ >> 3;
        } while (p_3._4_4_ != 0);
        pcVar4 = prepare_int_buffer<fmt::FormatSpec>(this,(uint)p_3,&spec,local_20,(uint)prefix);
        local_68 = get(pcVar4);
        p_3._4_4_ = num_digits;
        do {
          *local_68 = ((byte)p_3._4_4_ & 7) + 0x30;
          p_3._4_4_ = p_3._4_4_ >> 3;
          local_68 = local_68 + -1;
        } while (p_3._4_4_ != 0);
        return;
      }
      if (cVar2 != 'x') {
        cVar2 = FormatSpec::type(&spec);
        bVar1 = FormatSpec::flag(&spec,0x10);
        pcVar5 = "integer";
        if (bVar1) {
          pcVar5 = "char";
        }
        internal::report_unknown_type(cVar2,pcVar5);
        return;
      }
    }
    p_1._4_4_ = num_digits;
    bVar1 = FormatSpec::flag(&spec,8);
    if (bVar1) {
      uVar3 = (ulong)(uint)prefix;
      prefix = (char  [4])((int)prefix + 1);
      local_20[uVar3] = '0';
      cVar2 = FormatSpec::type(&spec);
      uVar3 = (ulong)(uint)prefix;
      prefix = (char  [4])((int)prefix + 1);
      local_20[uVar3] = cVar2;
    }
    p_1._0_4_ = 0;
    do {
      p_1._0_4_ = (uint)p_1 + 1;
      p_1._4_4_ = p_1._4_4_ >> 4;
    } while (p_1._4_4_ != 0);
    pcVar4 = prepare_int_buffer<fmt::FormatSpec>(this,(uint)p_1,&spec,local_20,(uint)prefix);
    digits = get(pcVar4);
    p_1._4_4_ = num_digits;
    cVar2 = FormatSpec::type(&spec);
    if (cVar2 == 'x') {
      local_88 = "0123456789abcdef";
    }
    else {
      local_88 = "0123456789ABCDEF";
    }
    do {
      *digits = local_88[p_1._4_4_ & 0xf];
      p_1._4_4_ = p_1._4_4_ >> 4;
      digits = digits + -1;
    } while (p_1._4_4_ != 0);
  }
  return;
}

Assistant:

void BasicWriter<Char>::write_int(T value, Spec spec) {
  unsigned prefix_size = 0;
  typedef typename internal::IntTraits<T>::MainType UnsignedType;
  UnsignedType abs_value = value;
  char prefix[4] = "";
  if (internal::is_negative(value)) {
    prefix[0] = '-';
    ++prefix_size;
    abs_value = 0 - abs_value;
  } else if (spec.flag(SIGN_FLAG)) {
    prefix[0] = spec.flag(PLUS_FLAG) ? '+' : ' ';
    ++prefix_size;
  }
  switch (spec.type()) {
  case 0: case 'd': {
    unsigned num_digits = internal::count_digits(abs_value);
    CharPtr p = prepare_int_buffer(
      num_digits, spec, prefix, prefix_size) + 1 - num_digits;
    internal::format_decimal(get(p), abs_value, num_digits);
    break;
  }
  case 'x': case 'X': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG)) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = spec.type();
    }
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 4) != 0);
    Char *p = get(prepare_int_buffer(
      num_digits, spec, prefix, prefix_size));
    n = abs_value;
    const char *digits = spec.type() == 'x' ?
        "0123456789abcdef" : "0123456789ABCDEF";
    do {
      *p-- = digits[n & 0xf];
    } while ((n >>= 4) != 0);
    break;
  }
  case 'b': case 'B': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG)) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = spec.type();
    }
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 1) != 0);
    Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
    n = abs_value;
    do {
      *p-- = static_cast<Char>('0' + (n & 1));
    } while ((n >>= 1) != 0);
    break;
  }
  case 'o': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG))
      prefix[prefix_size++] = '0';
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 3) != 0);
    Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
    n = abs_value;
    do {
      *p-- = static_cast<Char>('0' + (n & 7));
    } while ((n >>= 3) != 0);
    break;
  }
  default:
    internal::report_unknown_type(
      spec.type(), spec.flag(CHAR_FLAG) ? "char" : "integer");
    break;
  }
}